

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserStates.h
# Opt level: O2

bool gurkenlaeufer::isStepKeyword(string *word)

{
  bool bVar1;
  
  bVar1 = std::operator==(word,"given");
  if (!bVar1) {
    bVar1 = std::operator==(word,"when");
    if (!bVar1) {
      bVar1 = std::operator==(word,"then");
      if (!bVar1) {
        bVar1 = std::operator==(word,"and");
        if (!bVar1) {
          bVar1 = std::operator==(word,"but");
          return bVar1;
        }
      }
    }
  }
  return true;
}

Assistant:

inline bool isStepKeyword(std::string word)
{
    return word == "given" || word == "when" || word == "then" || word == "and" || word == "but";
}